

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

char * Diligent::GetShaderCompilerTypeString(SHADER_COMPILER Compiler)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if (Compiler < SHADER_COMPILER_COUNT) {
    pcVar1 = &DAT_00669740 + *(int *)(&DAT_00669740 + (ulong)Compiler * 4);
  }
  else {
    FormatString<char[27]>(&local_28,(char (*) [27])"Unexpected shader compiler");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderCompilerTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x5fd);
    std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "UNKNOWN";
  }
  return pcVar1;
}

Assistant:

const char* GetShaderCompilerTypeString(SHADER_COMPILER Compiler)
{
    static_assert(SHADER_COMPILER_LAST == 3, "Please update this function to handle the new shader compiler");
    switch (Compiler)
    {
        // clang-format off
        case SHADER_COMPILER_DEFAULT: return "Default";
        case SHADER_COMPILER_GLSLANG: return "glslang";
        case SHADER_COMPILER_DXC:     return "DXC";
        case SHADER_COMPILER_FXC:     return "FXC";
        // clang-format on
        default:
            UNEXPECTED("Unexpected shader compiler");
            return "UNKNOWN";
    }
}